

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.hh
# Opt level: O3

void __thiscall kratos::GeneratorConst::~GeneratorConst(GeneratorConst *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_Const).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_002a3928;
  pcVar2 = (this->super_Const).hex_value_._M_dataplus._M_p;
  paVar1 = &(this->super_Const).hex_value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Var::~Var((Var *)this);
  operator_delete(this,0x2a8);
  return;
}

Assistant:

explicit GeneratorConst(const Generator &gen) : Const(0, 1, false), gen_(gen) {}